

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.hpp
# Opt level: O3

char * __thiscall boost::filesystem::filesystem_error::what(filesystem_error *this)

{
  char *pcVar1;
  char *pcVar2;
  element_type *peVar3;
  
  peVar3 = (this->m_imp_ptr).px;
  if (peVar3 == (element_type *)0x0) {
    pcVar2 = system::system_error::what(&this->super_system_error);
    return pcVar2;
  }
  if ((peVar3->m_what)._M_string_length == 0) {
    pcVar2 = system::system_error::what(&this->super_system_error);
    peVar3 = (this->m_imp_ptr).px;
    if (peVar3 != (element_type *)0x0) {
      pcVar1 = (char *)(peVar3->m_what)._M_string_length;
      strlen(pcVar2);
      std::__cxx11::string::_M_replace((ulong)&peVar3->m_what,0,pcVar1,(ulong)pcVar2);
      peVar3 = (this->m_imp_ptr).px;
      if (peVar3 != (element_type *)0x0) {
        if ((peVar3->m_path1).m_pathname._M_string_length != 0) {
          std::__cxx11::string::append((char *)&peVar3->m_what);
          peVar3 = (this->m_imp_ptr).px;
          if (peVar3 == (element_type *)0x0) goto LAB_0010e8d0;
          std::__cxx11::string::_M_append
                    ((char *)&peVar3->m_what,(ulong)(peVar3->m_path1).m_pathname._M_dataplus._M_p);
          peVar3 = (this->m_imp_ptr).px;
          if (peVar3 == (element_type *)0x0) goto LAB_0010e8d0;
          std::__cxx11::string::append((char *)&peVar3->m_what);
          peVar3 = (this->m_imp_ptr).px;
          if (peVar3 == (element_type *)0x0) goto LAB_0010e8d0;
        }
        if ((peVar3->m_path2).m_pathname._M_string_length == 0) goto LAB_0010e8aa;
        std::__cxx11::string::append((char *)&peVar3->m_what);
        peVar3 = (this->m_imp_ptr).px;
        if (peVar3 != (element_type *)0x0) {
          std::__cxx11::string::_M_append
                    ((char *)&peVar3->m_what,(ulong)(peVar3->m_path2).m_pathname._M_dataplus._M_p);
          peVar3 = (this->m_imp_ptr).px;
          if (peVar3 != (element_type *)0x0) {
            std::__cxx11::string::append((char *)&peVar3->m_what);
            peVar3 = (this->m_imp_ptr).px;
            if (peVar3 != (element_type *)0x0) goto LAB_0010e8aa;
          }
        }
      }
    }
LAB_0010e8d0:
    __assert_fail("px != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Naios[P]boost-minimal-dist/boost/smart_ptr/shared_ptr.hpp"
                  ,0x2b5,
                  "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<boost::filesystem::filesystem_error::m_imp>::operator->() const [T = boost::filesystem::filesystem_error::m_imp]"
                 );
  }
LAB_0010e8aa:
  return (peVar3->m_what)._M_dataplus._M_p;
}

Assistant:

const char* what() const BOOST_NOEXCEPT_OR_NOTHROW
      {
        if (!m_imp_ptr.get())
        return system::system_error::what();

        try
        {
          if (m_imp_ptr->m_what.empty())
          {
            m_imp_ptr->m_what = system::system_error::what();
            if (!m_imp_ptr->m_path1.empty())
            {
              m_imp_ptr->m_what += ": \"";
              m_imp_ptr->m_what += m_imp_ptr->m_path1.string();
              m_imp_ptr->m_what += "\"";
            }
            if (!m_imp_ptr->m_path2.empty())
            {
              m_imp_ptr->m_what += ", \"";
              m_imp_ptr->m_what += m_imp_ptr->m_path2.string();
              m_imp_ptr->m_what += "\"";
            }
          }
          return m_imp_ptr->m_what.c_str();
        }
        catch (...)
        {
          return system::system_error::what();
        }
      }